

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAtomicCounterTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::AtomicCounterTest::iterate(AtomicCounterTest *this)

{
  allocator<unsigned_int> *paVar1;
  pointer *this_00;
  pointer *this_01;
  pointer *this_02;
  pointer *this_03;
  int iVar2;
  int iVar3;
  code *pcVar4;
  bool bVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  deUint32 dVar9;
  RenderContext *pRVar10;
  undefined4 extraout_var;
  TestLog *log_00;
  ProgramSources *sources;
  MessageBuilder *pMVar12;
  long lVar13;
  reference pvVar14;
  size_type sVar15;
  void *pvVar16;
  TestError *pTVar17;
  TestSpec *spec;
  undefined1 local_7d0 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> gets;
  vector<unsigned_int,_std::allocator<unsigned_int>_> postGets;
  vector<unsigned_int,_std::allocator<unsigned_int>_> preGets;
  vector<unsigned_int,_std::allocator<unsigned_int>_> decrements;
  vector<unsigned_int,_std::allocator<unsigned_int>_> increments;
  bool isOk;
  void *ptr_1;
  void *ptr;
  undefined1 local_738 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> counters;
  undefined1 local_718 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> output;
  undefined1 local_6f8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> data;
  MessageBuilder local_560;
  undefined4 local_3dc;
  MessageBuilder local_3d8;
  int local_258;
  int local_254;
  deInt32 ssoSize;
  deInt32 counterBufferSize;
  ShaderSource local_230;
  ProgramSources local_208;
  undefined1 local_138 [8];
  ShaderProgram program;
  undefined1 local_58 [8];
  Buffer outputBuffer;
  Buffer counterBuffer;
  TestLog *log;
  Functions *gl;
  AtomicCounterTest *this_local;
  long lVar11;
  
  pRVar10 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar8 = (*pRVar10->_vptr_RenderContext[3])();
  lVar11 = CONCAT44(extraout_var,iVar8);
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pRVar10 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)&outputBuffer.super_ObjectWrapper.m_object,
             pRVar10);
  pRVar10 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)local_58,pRVar10);
  pRVar10 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_208);
  Functional::(anonymous_namespace)::AtomicCounterTest::generateShaderSource_abi_cxx11_
            ((string *)&ssoSize,(AtomicCounterTest *)&this->m_spec,spec);
  glu::ShaderSource::ShaderSource(&local_230,SHADERTYPE_COMPUTE,(string *)&ssoSize);
  sources = glu::ProgramSources::operator<<(&local_208,&local_230);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_138,pRVar10,sources);
  glu::ShaderSource::~ShaderSource(&local_230);
  std::__cxx11::string::~string((string *)&ssoSize);
  glu::ProgramSources::~ProgramSources(&local_208);
  local_254 = (this->m_spec).atomicCounterCount << 2;
  iVar8 = (this->m_spec).atomicCounterCount;
  iVar2 = (this->m_spec).callCount;
  iVar3 = (this->m_spec).threadCount;
  local_258 = getOperationCount(this);
  local_258 = iVar8 * iVar2 * iVar3 * 4 * local_258;
  glu::operator<<(log_00,(ShaderProgram *)local_138);
  if (((((this->m_spec).offsetType == OFFSETTYPE_INVALID) ||
       ((this->m_spec).offsetType == OFFSETTYPE_INVALID_DEFAULT)) ||
      ((this->m_spec).bindingType == BINDINGTYPE_INVALID)) ||
     (((this->m_spec).bindingType == BINDINGTYPE_INVALID_DEFAULT ||
      ((this->m_spec).offsetType == OFFSETTYPE_INVALID_OVERLAPPING)))) {
    bVar5 = glu::ShaderProgram::isOk((ShaderProgram *)local_138);
    if (bVar5) {
      tcu::TestLog::operator<<(&local_3d8,log_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar12 = tcu::MessageBuilder::operator<<
                          (&local_3d8,
                           (char (*) [50])"Expected program to fail, but compilation passed.");
      tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_3d8);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Compile succeeded");
      local_3dc = 1;
    }
    else {
      tcu::TestLog::operator<<(&local_560,log_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar12 = tcu::MessageBuilder::operator<<
                          (&local_560,(char (*) [32])"Compilation failed as expected.");
      tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_560);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Compile failed");
      local_3dc = 1;
    }
  }
  else {
    bVar5 = glu::ShaderProgram::isOk((ShaderProgram *)local_138);
    if (bVar5) {
      pcVar4 = *(code **)(lVar11 + 0x1680);
      dVar9 = glu::ShaderProgram::getProgram((ShaderProgram *)local_138);
      (*pcVar4)(dVar9);
      dVar9 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar9,"glUseProgram()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                      ,0x3b7);
      pcVar4 = *(code **)(lVar11 + 0x40);
      dVar9 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_58);
      (*pcVar4)(0x90d2,dVar9);
      (**(code **)(lVar11 + 0x150))(0x90d2,(long)local_258,0,0x88e4);
      dVar9 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar9,"Failed to create output buffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                      ,0x3bc);
      iVar8 = (this->m_spec).atomicCounterCount;
      output.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = getInitialValue(this);
      paVar1 = (allocator<unsigned_int> *)
               ((long)&output.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 3);
      std::allocator<unsigned_int>::allocator(paVar1);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_6f8,(long)iVar8,
                 (value_type_conflict4 *)
                 ((long)&output.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 4),paVar1);
      std::allocator<unsigned_int>::~allocator
                ((allocator<unsigned_int> *)
                 ((long)&output.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
      pcVar4 = *(code **)(lVar11 + 0x40);
      dVar9 = glu::ObjectWrapper::operator*
                        ((ObjectWrapper *)&outputBuffer.super_ObjectWrapper.m_object);
      (*pcVar4)(0x90d2,dVar9);
      pcVar4 = *(code **)(lVar11 + 0x150);
      lVar13 = (long)local_254;
      pvVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_6f8,0);
      (*pcVar4)(0x90d2,lVar13,pvVar14,0x88e4);
      dVar9 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar9,"Failed to create buffer for atomic counters",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                      ,0x3c3);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_6f8);
      pcVar4 = *(code **)(lVar11 + 0x48);
      dVar9 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_58);
      (*pcVar4)(0x90d2,1,dVar9);
      dVar9 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar9,"Failed to setup output buffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                      ,0x3c8);
      pcVar4 = *(code **)(lVar11 + 0x48);
      dVar9 = glu::ObjectWrapper::operator*
                        ((ObjectWrapper *)&outputBuffer.super_ObjectWrapper.m_object);
      (*pcVar4)(0x92c0,1,dVar9);
      dVar9 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar9,"Failed to setup atomic counter buffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                      ,0x3cc);
      (**(code **)(lVar11 + 0x528))((this->m_spec).threadCount,1);
      dVar9 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar9,"glDispatchCompute()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                      ,0x3d0);
      (**(code **)(lVar11 + 0x648))();
      dVar9 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar9,"glFinish()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                      ,0x3d3);
      iVar8 = local_258;
      if (local_258 < 0) {
        iVar8 = local_258 + 3;
      }
      counters.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      paVar1 = (allocator<unsigned_int> *)
               ((long)&counters.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 3);
      std::allocator<unsigned_int>::allocator(paVar1);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_718,(long)(iVar8 >> 2)
                 ,(value_type_conflict4 *)
                  ((long)&counters.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage + 4),paVar1);
      std::allocator<unsigned_int>::~allocator
                ((allocator<unsigned_int> *)
                 ((long)&counters.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
      iVar8 = (this->m_spec).atomicCounterCount;
      ptr._4_4_ = 0;
      std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&ptr + 3));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_738,(long)iVar8,
                 (value_type_conflict4 *)((long)&ptr + 4),
                 (allocator<unsigned_int> *)((long)&ptr + 3));
      std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&ptr + 3));
      pcVar4 = *(code **)(lVar11 + 0x40);
      dVar9 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_58);
      (*pcVar4)(0x90d2,dVar9);
      dVar9 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar9,"glBindBuffer()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                      ,0x3db);
      pcVar4 = *(code **)(lVar11 + 0xd00);
      sVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_718);
      pvVar16 = (void *)(*pcVar4)(0x90d2,0,sVar15 << 2,1);
      dVar9 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar9,"glMapBufferRange()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                      ,0x3de);
      pvVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_718,0);
      sVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_718);
      ::deMemcpy(pvVar14,pvVar16,(long)(int)sVar15 << 2);
      cVar6 = (**(code **)(lVar11 + 0x1670))(0x90d2);
      if (cVar6 == '\0') {
        dVar9 = (**(code **)(lVar11 + 0x800))();
        glu::checkError(dVar9,"glUnmapBuffer()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                        ,0x3e4);
        ::deGetFalse();
        pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar17,"Mapped buffer corrupted","false",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                   ,0x3e5);
        __cxa_throw(pTVar17,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      (**(code **)(lVar11 + 0x40))(0x90d2,0);
      dVar9 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar9,"glBindBuffer()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                      ,0x3e9);
      pcVar4 = *(code **)(lVar11 + 0x40);
      dVar9 = glu::ObjectWrapper::operator*
                        ((ObjectWrapper *)&outputBuffer.super_ObjectWrapper.m_object);
      (*pcVar4)(0x90d2,dVar9);
      dVar9 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar9,"glBindBuffer()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                      ,0x3ef);
      pcVar4 = *(code **)(lVar11 + 0xd00);
      sVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_738);
      pvVar16 = (void *)(*pcVar4)(0x90d2,0,sVar15 << 2,1);
      dVar9 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar9,"glMapBufferRange()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                      ,0x3f2);
      pvVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_738,0);
      sVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_738);
      ::deMemcpy(pvVar14,pvVar16,(long)(int)sVar15 << 2);
      cVar6 = (**(code **)(lVar11 + 0x1670))(0x90d2);
      if (cVar6 == '\0') {
        dVar9 = (**(code **)(lVar11 + 0x800))();
        glu::checkError(dVar9,"glUnmapBuffer()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                        ,0x3f8);
        ::deGetFalse();
        pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar17,"Mapped buffer corrupted","false",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                   ,0x3f9);
        __cxa_throw(pTVar17,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      (**(code **)(lVar11 + 0x40))(0x90d2,0);
      dVar9 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar9,"glBindBuffer()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fAtomicCounterTests.cpp"
                      ,0x3fd);
      bVar5 = checkAndLogCounterValues
                        (this,log_00,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_738);
      this_00 = &decrements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
      this_01 = &preGets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01);
      this_02 = &postGets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_02);
      this_03 = &gets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_03);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7d0);
      splitBuffer(this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_718,
                  (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,
                  (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01,
                  (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_02,
                  (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_03,
                  (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7d0);
      bVar7 = checkAndLogCallValues
                        (this,log_00,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &decrements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &preGets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &postGets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &gets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7d0);
      if (!bVar7) {
        bVar5 = false;
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7d0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &gets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &postGets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &preGets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &decrements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage);
      if (bVar5) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
      }
      local_3dc = 1;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_738);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_718);
    }
    else {
      tcu::TestLog::operator<<
                ((MessageBuilder *)
                 &data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,log_00,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar12 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)
                           &data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (char (*) [16])"Compile failed.");
      tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder
                ((MessageBuilder *)
                 &data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Compile failed");
      local_3dc = 1;
    }
  }
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_138);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)local_58);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)&outputBuffer.super_ObjectWrapper.m_object);
  return STOP;
}

Assistant:

TestCase::IterateResult AtomicCounterTest::iterate (void)
{
	const glw::Functions&		gl					= m_context.getRenderContext().getFunctions();
	TestLog&					log					= m_testCtx.getLog();
	const glu::Buffer			counterBuffer		(m_context.getRenderContext());
	const glu::Buffer			outputBuffer		(m_context.getRenderContext());
	const glu::ShaderProgram	program				(m_context.getRenderContext(), glu::ProgramSources() << glu::ShaderSource(glu::SHADERTYPE_COMPUTE, generateShaderSource(m_spec)));

	const deInt32				counterBufferSize	= m_spec.atomicCounterCount * 4;
	const deInt32				ssoSize				= m_spec.atomicCounterCount * m_spec.callCount * m_spec.threadCount * 4 * getOperationCount();

	log << program;

	if (m_spec.offsetType == OFFSETTYPE_INVALID || m_spec.offsetType == OFFSETTYPE_INVALID_DEFAULT || m_spec.bindingType == BINDINGTYPE_INVALID || m_spec.bindingType == BINDINGTYPE_INVALID_DEFAULT || m_spec.offsetType == OFFSETTYPE_INVALID_OVERLAPPING)
	{
		if (program.isOk())
		{
			log << TestLog::Message << "Expected program to fail, but compilation passed." << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compile succeeded");
			return STOP;
		}
		else
		{
			log << TestLog::Message << "Compilation failed as expected." << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Compile failed");
			return STOP;
		}
	}
	else if (!program.isOk())
	{
		log << TestLog::Message << "Compile failed." << TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compile failed");
		return STOP;
	}

	gl.useProgram(program.getProgram());
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram()");

	// Create output buffer
	gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer);
	gl.bufferData(GL_SHADER_STORAGE_BUFFER, ssoSize, NULL, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to create output buffer");

	// Create atomic counter buffer
	{
		vector<deUint32> data(m_spec.atomicCounterCount, getInitialValue());
		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *counterBuffer);
		gl.bufferData(GL_SHADER_STORAGE_BUFFER, counterBufferSize, &(data[0]), GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to create buffer for atomic counters");
	}

	// Bind output buffer
	gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, *outputBuffer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to setup output buffer");

	// Bind atomic counter buffer
	gl.bindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 1, *counterBuffer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to setup atomic counter buffer");

	// Dispath compute
	gl.dispatchCompute(m_spec.threadCount, 1, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute()");

	gl.finish();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFinish()");

	vector<deUint32> output(ssoSize/4, 0);
	vector<deUint32> counters(m_spec.atomicCounterCount, 0);

	// Read back output buffer
	{
		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer()");

		void* ptr = gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, (GLsizeiptr)(output.size() * sizeof(deUint32)), GL_MAP_READ_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange()");

		deMemcpy(&(output[0]), ptr, (int)output.size() * sizeof(deUint32));

		if (!gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER))
		{
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer()");
			TCU_CHECK_MSG(false, "Mapped buffer corrupted");
		}

		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer()");
	}

	// Read back counter buffer
	{
		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *counterBuffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer()");

		void* ptr = gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, (GLsizeiptr)(counters.size() * sizeof(deUint32)), GL_MAP_READ_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange()");

		deMemcpy(&(counters[0]), ptr, (int)counters.size() * sizeof(deUint32));

		if (!gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER))
		{
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer()");
			TCU_CHECK_MSG(false, "Mapped buffer corrupted");
		}

		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer()");
	}

	bool isOk = true;

	if (!checkAndLogCounterValues(log, counters))
		isOk = false;

	{
		vector<deUint32> increments;
		vector<deUint32> decrements;
		vector<deUint32> preGets;
		vector<deUint32> postGets;
		vector<deUint32> gets;

		splitBuffer(output, increments, decrements, preGets, postGets, gets);

		if (!checkAndLogCallValues(log, increments, decrements, preGets, postGets, gets))
			isOk = false;
	}

	if (isOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

	return STOP;
}